

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O0

FSerializer * Serialize(FSerializer *arc,char *key,ReverbContainer **c,ReverbContainer **def)

{
  bool bVar1;
  ReverbContainer *pRVar2;
  uint local_30;
  uint local_2c;
  ReverbContainer **ppRStack_28;
  int id;
  ReverbContainer **def_local;
  ReverbContainer **c_local;
  char *key_local;
  FSerializer *arc_local;
  
  ppRStack_28 = def;
  def_local = c;
  c_local = (ReverbContainer **)key;
  key_local = (char *)arc;
  bVar1 = FSerializer::isReading(arc);
  if ((bVar1) || (*def_local == (ReverbContainer *)0x0)) {
    local_30 = 0;
  }
  else {
    local_30 = (uint)(*def_local)->ID;
  }
  local_2c = local_30;
  Serialize((FSerializer *)key_local,(char *)c_local,(int32_t *)&local_2c,(int32_t *)0x0);
  bVar1 = FSerializer::isReading((FSerializer *)key_local);
  if (bVar1) {
    pRVar2 = S_FindEnvironment(local_2c);
    *def_local = pRVar2;
  }
  return (FSerializer *)key_local;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, ReverbContainer *&c, ReverbContainer **def)
{
	int id = (arc.isReading() || c == nullptr) ? 0 : c->ID;
	Serialize(arc, key, id, nullptr);
	if (arc.isReading())
	{
		c = S_FindEnvironment(id);
	}
	return arc;
}